

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseContextBase.cpp
# Opt level: O3

void __thiscall
glslang::TParseContextBase::ppError
          (TParseContextBase *this,TSourceLoc *loc,char *szReason,char *szToken,
          char *szExtraInfoFormat,...)

{
  TInputScanner *pTVar1;
  va_list args;
  
  (*(this->super_TParseVersions)._vptr_TParseVersions[0x4c])(this);
  if (((this->super_TParseVersions).messages & EShMsgCascadingErrors) == EShMsgDefault) {
    pTVar1 = (this->super_TParseVersions).currentScanner;
    pTVar1->endOfFileReached = true;
    pTVar1->currentSource = pTVar1->numSources;
  }
  return;
}

Assistant:

void C_DECL TParseContextBase::ppError(const TSourceLoc& loc, const char* szReason, const char* szToken,
                                       const char* szExtraInfoFormat, ...)
{
    va_list args;
    va_start(args, szExtraInfoFormat);
    outputMessage(loc, szReason, szToken, szExtraInfoFormat, EPrefixError, args);
    va_end(args);

    if ((messages & EShMsgCascadingErrors) == 0)
        currentScanner->setEndOfInput();
}